

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void array_suite::fail_missing_end(void)

{
  bool value [4];
  value_type input [6];
  iarchive in;
  bool local_d4 [9] [4];
  uchar local_b0 [8];
  iarchive local_a8;
  
  local_b0[4] = 0x80;
  local_b0[5] = 0x81;
  local_b0[0] = 0x92;
  local_b0[1] = '\x04';
  local_b0[2] = 0x80;
  local_b0[3] = 0x81;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>(&local_a8,(uchar (*) [6])local_b0)
  ;
  local_d4[0][0] = false;
  local_d4[0][1] = false;
  local_d4[0][2] = false;
  local_d4[0][3] = false;
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_bool[4],_void>::load(&local_a8,local_d4,0);
  boost::detail::throw_failed_impl
            ("in >> value","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x129,"void array_suite::fail_missing_end()");
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void fail_missing_end()
{
    const value_type input[] = { token::code::begin_array,
                                 0x04,
                                 0x80, 0x81, 0x80, 0x81 };
    format::iarchive in(input);
    bool value[4] = { false, false, false, false };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(in >> value,
                                    format::error, "expected end array bracket");
}